

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O1

size_t __thiscall geometrycentral::MarkedDisjointSets::find(MarkedDisjointSets *this,size_t x)

{
  size_t sVar1;
  
  sVar1 = (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[x];
  if (sVar1 != x) {
    sVar1 = find(this,sVar1);
    (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[x] = sVar1;
  }
  return (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[x];
}

Assistant:

size_t MarkedDisjointSets::find(size_t x) {
  if (x != parent[x]) parent[x] = find(parent[x]);
  return parent[x];
}